

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int fftm2s(int year,int month,int day,int hour,int minute,double second,int decimals,char *datestr,
          int *status)

{
  int iVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  uint in_R8D;
  uint in_R9D;
  double in_XMM0_Qa;
  int unaff_retaddr;
  char *in_stack_00000008;
  int *in_stack_00000010;
  char errmsg [81];
  int width;
  char local_88 [96];
  uint local_28;
  uint local_24;
  double local_20;
  uint local_18;
  uint local_14;
  int in_stack_fffffffffffffffc;
  
  if (*in_stack_00000010 < 1) {
    *in_stack_00000008 = '\0';
    local_24 = in_R9D;
    local_20 = in_XMM0_Qa;
    local_18 = in_R8D;
    local_14 = in_ECX;
    if ((((in_EDI == 0) && (in_ESI == 0)) && (in_EDX == 0)) ||
       (iVar1 = ffverifydate(unaff_retaddr,in_stack_fffffffffffffffc,in_EDI,
                             (int *)CONCAT44(in_ESI,in_EDX)), iVar1 < 1)) {
      if (((int)local_14 < 0) || (0x17 < (int)local_14)) {
        snprintf(local_88,0x51,"input hour value is out of range 0 - 23: %d (fftm2s)",
                 (ulong)local_14);
        ffpmsg((char *)0x254c80);
        *in_stack_00000010 = 0x1a4;
        iVar1 = 0x1a4;
      }
      else if (((int)local_18 < 0) || (0x3b < (int)local_18)) {
        snprintf(local_88,0x51,"input minute value is out of range 0 - 59: %d (fftm2s)",
                 (ulong)local_18);
        ffpmsg((char *)0x254cdb);
        *in_stack_00000010 = 0x1a4;
        iVar1 = 0x1a4;
      }
      else if ((local_20 < 0.0) || (61.0 <= local_20)) {
        snprintf(local_88,0x51,"input second value is out of range 0 - 60.999: %f (fftm2s)",local_20
                );
        ffpmsg((char *)0x254d49);
        *in_stack_00000010 = 0x1a4;
        iVar1 = 0x1a4;
      }
      else if ((int)local_24 < 0x1a) {
        if (local_24 == 0) {
          local_28 = 2;
        }
        else {
          local_28 = local_24 + 3;
        }
        if ((int)local_24 < 0) {
          sprintf(in_stack_00000008,"%.4d-%.2d-%.2d",(ulong)in_EDI,(ulong)in_ESI,(ulong)in_EDX);
        }
        else if (((in_EDI == 0) && (in_ESI == 0)) && (in_EDX == 0)) {
          sprintf(in_stack_00000008,"%.2d:%.2d:%0*.*f",local_20,(ulong)local_14,(ulong)local_18,
                  (ulong)local_28,(ulong)local_24);
        }
        else {
          sprintf(in_stack_00000008,"%.4d-%.2d-%.2dT%.2d:%.2d:%0*.*f",local_20,(ulong)in_EDI,
                  (ulong)in_ESI,(ulong)in_EDX,(ulong)local_14,local_18,local_28,local_24);
        }
        iVar1 = *in_stack_00000010;
      }
      else {
        snprintf(local_88,0x51,"input decimals value is out of range 0 - 25: %d (fftm2s)",
                 (ulong)local_24);
        ffpmsg((char *)0x254d9a);
        *in_stack_00000010 = 0x1a4;
        iVar1 = 0x1a4;
      }
    }
    else {
      ffpmsg((char *)0x254c2b);
      iVar1 = *in_stack_00000010;
    }
  }
  else {
    iVar1 = *in_stack_00000010;
  }
  return iVar1;
}

Assistant:

int fftm2s(int year,          /* I - year (0 - 9999)           */
           int month,         /* I - month (1 - 12)            */
           int day,           /* I - day (1 - 31)              */
           int hour,          /* I - hour (0 - 23)             */
           int minute,        /* I - minute (0 - 59)           */
           double second,     /* I - second (0. - 60.9999999)  */
           int decimals,      /* I - number of decimal points to write      */
           char *datestr,     /* O - date string: "YYYY-MM-DDThh:mm:ss.ddd" */
                              /*   or "hh:mm:ss.ddd" if year, month day = 0 */
           int   *status)     /* IO - error status             */
/*
  Construct a date and time character string
*/
{
    int width;
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datestr='\0';

    if (year != 0 || month != 0 || day !=0)
    { 
        if (ffverifydate(year, month, day, status) > 0)
	{
            ffpmsg("invalid date (fftm2s)");
            return(*status);
        }
    }

    if (hour < 0 || hour > 23)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input hour value is out of range 0 - 23: %d (fftm2s)", hour);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (minute < 0 || minute > 59)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input minute value is out of range 0 - 59: %d (fftm2s)", minute);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (second < 0. || second >= 61)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input second value is out of range 0 - 60.999: %f (fftm2s)", second);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (decimals > 25)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input decimals value is out of range 0 - 25: %d (fftm2s)", decimals);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }

    if (decimals == 0)
       width = 2;
    else
       width = decimals + 3;

    if (decimals < 0)
    {
        /* a negative decimals value means return only the date, not time */
        sprintf(datestr, "%.4d-%.2d-%.2d", year, month, day);
    }
    else if (year == 0 && month == 0 && day == 0)
    {
        /* return only the time, not the date */
        sprintf(datestr, "%.2d:%.2d:%0*.*f",
            hour, minute, width, decimals, second);
    }
    else
    {
        /* return both the time and date */
        sprintf(datestr, "%.4d-%.2d-%.2dT%.2d:%.2d:%0*.*f",
            year, month, day, hour, minute, width, decimals, second);
    }
    return(*status);
}